

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

QString * systemThemeName(void)

{
  QString *override;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable((char *)in_RDI);
  if (in_RDI->size == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    if (QGuiApplicationPrivate::platform_theme != (QPlatformTheme *)0x0) {
      local_38._16_4_ = 0xaaaaaaaa;
      local_38._20_4_ = 0xaaaaaaaa;
      uStack_20 = 0xaaaaaaaa;
      uStack_1c = 0xaaaaaaaa;
      local_38._0_4_ = 0xaaaaaaaa;
      local_38._4_4_ = 0xaaaaaaaa;
      local_38._8_4_ = 0xaaaaaaaa;
      local_38._12_4_ = 0xaaaaaaaa;
      (*QGuiApplicationPrivate::platform_theme->_vptr_QPlatformTheme[0xc])
                (&local_38,QGuiApplicationPrivate::platform_theme,0xe);
      if (3 < CONCAT44(uStack_1c,uStack_20)) {
        QVariant::toString();
        QVariant::~QVariant((QVariant *)&local_38);
        goto LAB_0025f708;
      }
      QVariant::~QVariant((QVariant *)&local_38);
    }
    in_RDI->d = (Data *)0x0;
    in_RDI->ptr = (char16_t *)0x0;
    in_RDI->size = 0;
  }
LAB_0025f708:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline QString systemThemeName()
{
    if (QString override = qEnvironmentVariable("QT_QPA_SYSTEM_ICON_THEME"); !override.isEmpty())
        return override;
    if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
        const QVariant themeHint = theme->themeHint(QPlatformTheme::SystemIconThemeName);
        if (themeHint.isValid())
            return themeHint.toString();
    }
    return QString();
}